

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

void __thiscall
ArgumentParser::Instance::
Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
          (Instance *this,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args,size_t pos)

{
  string_view *psVar1;
  long lVar2;
  
  psVar1 = args->_M_array;
  for (lVar2 = args->_M_len << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    Consume(this,pos,*psVar1);
    psVar1 = psVar1 + 1;
    pos = pos + 1;
  }
  FinishKeyword(this);
  return;
}

Assistant:

void Parse(Range const& args, std::size_t pos = 0)
  {
    for (cm::string_view arg : args) {
      this->Consume(pos++, arg);
    }
    this->FinishKeyword();
  }